

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForScalar
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *pIVar1;
  long *plVar2;
  long *plVar3;
  string struct_var;
  string field_method;
  string field_field;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(local_70,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[4])(local_90,pIVar1,field);
  (*(pIVar1->super_Namer)._vptr_Namer[7])(local_b0,pIVar1,struct_def);
  GenIndents_abi_cxx11_(&local_50,this,2);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_190 = &local_180;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_180 = *plVar3;
    lStack_178 = plVar2[3];
  }
  else {
    local_180 = *plVar3;
    local_190 = (long *)*plVar2;
  }
  local_188 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_70[0]);
  local_170 = &local_160;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_160 = *plVar3;
    lStack_158 = plVar2[3];
  }
  else {
    local_160 = *plVar3;
    local_170 = (long *)*plVar2;
  }
  local_168 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_170);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_120 = *plVar3;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar3;
    local_130 = (long *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_b0[0]);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_100 = *plVar3;
    lStack_f8 = plVar2[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar3;
    local_110 = (long *)*plVar2;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_e0 = *plVar3;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar3;
    local_f0 = (long *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_90[0]);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_140 = *plVar3;
    lStack_138 = plVar2[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar3;
    local_150 = (long *)*plVar2;
  }
  local_148 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_150);
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void GenUnPackForScalar(const StructDef &struct_def, const FieldDef &field,
                          std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_var = namer_.Variable(struct_def);

    code += GenIndents(2) + "self." + field_field + " = " + struct_var + "." +
            field_method + "()";
  }